

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

void __thiscall Application::run(Application *this)

{
  char cVar1;
  exception *e;
  char action;
  Application *this_local;
  
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while (cVar1 = queryAction(this), cVar1 == '1') {
            queryEnterOrder(this);
          }
          if (cVar1 != '2') break;
          queryCancelOrder(this);
        }
        if (cVar1 != '3') break;
        queryReplaceOrder(this);
      }
      if (cVar1 != '4') break;
      queryMarketDataRequest(this);
    }
  } while (cVar1 != '5');
  return;
}

Assistant:

void Application::run() {
  while (true) {
    try {
      char action = queryAction();

      if (action == '1') {
        queryEnterOrder();
      } else if (action == '2') {
        queryCancelOrder();
      } else if (action == '3') {
        queryReplaceOrder();
      } else if (action == '4') {
        queryMarketDataRequest();
      } else if (action == '5') {
        break;
      }
    } catch (std::exception &e) {
      std::cout << "Message Not Sent: " << e.what();
    }
  }
}